

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

bool __thiscall
cfd::core::Pubkey::VerifyBitcoinMessage
          (Pubkey *this,ByteData *signature,string *message,Pubkey *pubkey)

{
  bool bVar1;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Bitcoin Signed Message:\n","");
  bVar1 = VerifyMessage(this,signature,message,&local_50,pubkey);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool Pubkey::VerifyBitcoinMessage(
    const ByteData &signature, const std::string &message,
    Pubkey *pubkey) const {
  return VerifyMessage(
      signature, message, std::string(kBitcoinMessageMagic), pubkey);
}